

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# glsBuiltinPrecisionTests.cpp
# Opt level: O3

Value * __thiscall
deqp::gls::BuiltinPrecisionTests::DefaultSampling<tcu::Matrix<float,_4,_3>_>::genRandom
          (Value *__return_storage_ptr__,DefaultSampling<tcu::Matrix<float,_4,_3>_> *this,
          FloatFormat *fmt,Precision prec,Random *rnd)

{
  undefined1 auVar1 [16];
  undefined1 auVar2 [16];
  Vector<float,_4> *pVVar3;
  long lVar4;
  long lVar5;
  undefined8 uVar6;
  undefined8 extraout_RDX;
  long lVar7;
  DefaultSampling<float> *this_00;
  float *pfVar8;
  int rowNdx;
  float fVar9;
  undefined1 auVar10 [16];
  bool bVar12;
  undefined4 uVar13;
  long lVar11;
  
  (__return_storage_ptr__->m_data).m_data[2].m_data[0] = 0.0;
  (__return_storage_ptr__->m_data).m_data[2].m_data[1] = 0.0;
  pVVar3 = (__return_storage_ptr__->m_data).m_data;
  pVVar3[2].m_data[2] = 0.0;
  pVVar3[2].m_data[3] = 0.0;
  (__return_storage_ptr__->m_data).m_data[1].m_data[0] = 0.0;
  (__return_storage_ptr__->m_data).m_data[1].m_data[1] = 0.0;
  pVVar3 = (__return_storage_ptr__->m_data).m_data;
  pVVar3[1].m_data[2] = 0.0;
  pVVar3[1].m_data[3] = 0.0;
  (__return_storage_ptr__->m_data).m_data[0].m_data[0] = 0.0;
  (__return_storage_ptr__->m_data).m_data[0].m_data[1] = 0.0;
  (__return_storage_ptr__->m_data).m_data[0].m_data[2] = 0.0;
  auVar2 = _DAT_019f34d0;
  auVar1 = _DAT_019ec5b0;
  (__return_storage_ptr__->m_data).m_data[0].m_data[3] = 0.0;
  pVVar3 = (__return_storage_ptr__->m_data).m_data + 1;
  lVar4 = 0;
  lVar5 = 0;
  do {
    lVar7 = 0;
    auVar10 = auVar2;
    do {
      bVar12 = SUB164(auVar10 ^ auVar1,4) == -0x80000000 && SUB164(auVar10 ^ auVar1,0) < -0x7ffffffd
      ;
      if (bVar12) {
        uVar13 = 0x3f800000;
        if (lVar4 != lVar7) {
          uVar13 = 0;
        }
        *(undefined4 *)
         ((long)((Vector<tcu::Vector<float,_4>,_3> *)(pVVar3 + -1))->m_data[0].m_data + lVar7) =
             uVar13;
      }
      if (bVar12) {
        uVar13 = 0x3f800000;
        if (lVar4 + -0x10 != lVar7) {
          uVar13 = 0;
        }
        *(undefined4 *)((long)pVVar3->m_data + lVar7) = uVar13;
      }
      lVar11 = auVar10._8_8_;
      auVar10._0_8_ = auVar10._0_8_ + 2;
      auVar10._8_8_ = lVar11 + 2;
      lVar7 = lVar7 + 0x20;
    } while (lVar7 != 0x40);
    lVar5 = lVar5 + 1;
    lVar4 = lVar4 + 0x10;
    pVVar3 = (Vector<float,_4> *)(pVVar3->m_data + 1);
  } while (lVar5 != 4);
  lVar4 = 0;
  this_00 = (DefaultSampling<float> *)0x40;
  uVar6 = 4;
  pfVar8 = (float *)__return_storage_ptr__;
  do {
    lVar5 = -0x30;
    do {
      fVar9 = DefaultSampling<float>::genRandom(this_00,fmt,(Precision)uVar6,rnd);
      *(float *)((long)pfVar8 + lVar5 + 0x30) = fVar9;
      lVar5 = lVar5 + 0x10;
      uVar6 = extraout_RDX;
    } while (lVar5 != 0);
    lVar4 = lVar4 + 1;
    pfVar8 = pfVar8 + 1;
  } while (lVar4 != 4);
  return __return_storage_ptr__;
}

Assistant:

Value	genRandom	(const FloatFormat& fmt, Precision prec, Random& rnd) const
	{
		Value ret;

		for (int rowNdx = 0; rowNdx < Rows; ++rowNdx)
			for (int colNdx = 0; colNdx < Columns; ++colNdx)
				ret(rowNdx, colNdx) = instance<DefaultSampling<T> >().genRandom(fmt, prec, rnd);

		return ret;
	}